

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Intermediate.cpp
# Opt level: O3

bool glslang::canSignedIntTypeRepresentAllUnsignedValues(TBasicType sintType,TBasicType uintType)

{
  byte bVar1;
  
  switch(sintType) {
  case EbtInt8:
    if ((6 < uintType - EbtUint8) || ((0x55U >> (uintType - EbtUint8 & 0x1f) & 1) == 0)) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/Intermediate.cpp"
                    ,0x63f,
                    "bool glslang::canSignedIntTypeRepresentAllUnsignedValues(TBasicType, TBasicType)"
                   );
    }
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/Intermediate.cpp"
                  ,0x66a,
                  "bool glslang::canSignedIntTypeRepresentAllUnsignedValues(TBasicType, TBasicType)"
                 );
  case EbtInt16:
    if ((6 < uintType - EbtUint8) || ((0x55U >> (uintType - EbtUint8 & 0x1f) & 1) == 0)) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/Intermediate.cpp"
                    ,0x64c,
                    "bool glslang::canSignedIntTypeRepresentAllUnsignedValues(TBasicType, TBasicType)"
                   );
    }
    bVar1 = 0x2b;
    goto LAB_00497d7e;
  case EbtInt:
    bVar1 = 1;
    if ((uintType == EbtUint8) || (uintType == EbtUint16)) goto LAB_00497d82;
    if (uintType != EbtUint) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/Intermediate.cpp"
                    ,0x658,
                    "bool glslang::canSignedIntTypeRepresentAllUnsignedValues(TBasicType, TBasicType)"
                   );
    }
    break;
  case EbtInt64:
    if ((6 < uintType - EbtUint8) || ((0x55U >> (uintType - EbtUint8 & 0x1f) & 1) == 0)) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/Intermediate.cpp"
                    ,0x665,
                    "bool glslang::canSignedIntTypeRepresentAllUnsignedValues(TBasicType, TBasicType)"
                   );
    }
    bVar1 = 0x3f;
LAB_00497d7e:
    bVar1 = bVar1 >> ((char)uintType - 5U & 0x1f);
    goto LAB_00497d82;
  }
  bVar1 = 0;
LAB_00497d82:
  return (bool)(bVar1 & 1);
}

Assistant:

static bool canSignedIntTypeRepresentAllUnsignedValues(TBasicType sintType, TBasicType uintType)
{
    switch(sintType) {
    case EbtInt8:
        switch(uintType) {
        case EbtUint8:
        case EbtUint16:
        case EbtUint:
        case EbtUint64:
            return false;
        default:
            assert(false);
            return false;
        }
        break;
    case EbtInt16:
        switch(uintType) {
        case EbtUint8:
            return true;
        case EbtUint16:
        case EbtUint:
        case EbtUint64:
            return false;
        default:
            assert(false);
            return false;
        }
        break;
    case EbtInt:
        switch(uintType) {
        case EbtUint8:
        case EbtUint16:
            return true;
        case EbtUint:
            return false;
        default:
            assert(false);
            return false;
        }
        break;
    case EbtInt64:
        switch(uintType) {
        case EbtUint8:
        case EbtUint16:
        case EbtUint:
            return true;
        case EbtUint64:
            return false;
        default:
            assert(false);
            return false;
        }
        break;
    default:
        assert(false);
        return false;
    }
}